

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pocman.cpp
# Opt level: O3

bool __thiscall despot::Pocman::SmellFood(Pocman *this,PocmanState *pocstate)

{
  long lVar1;
  undefined8 uVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int local_38;
  int local_34;
  
  despot::Coord::Coord((Coord *)&local_38);
  iVar5 = this->smell_range_;
  iVar3 = -iVar5;
  if (-1 < iVar5) {
    do {
      _local_38 = CONCAT44(-iVar5,iVar3);
      iVar4 = iVar3;
      if (-1 < iVar5) {
        do {
          lVar1 = despot::operator+(&pocstate->pocman_pos,(Coord *)&local_38);
          if ((((-1 < (int)lVar1) && (-1 < lVar1)) && ((int)lVar1 < (this->maze_).xsize_)) &&
             ((int)((ulong)lVar1 >> 0x20) < (this->maze_).ysize_)) {
            uVar2 = despot::operator+(&pocstate->pocman_pos,(Coord *)&local_38);
            iVar3 = (int)((ulong)uVar2 >> 0x20) * (this->maze_).xsize_;
            iVar5 = iVar3 + (int)uVar2;
            iVar3 = (int)uVar2 + iVar3 + 0x3f;
            if (-1 < iVar5) {
              iVar3 = iVar5;
            }
            if (((pocstate->food).super__Bvector_base<std::allocator<bool>_>._M_impl.
                 super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
                 [(long)(iVar3 >> 6) +
                  (ulong)(((long)iVar5 & 0x800000000000003fU) < 0x8000000000000001) +
                  0xffffffffffffffff] >> ((long)iVar5 & 0x3fU) & 1) != 0) {
              return true;
            }
          }
          iVar3 = local_34;
          _local_38 = CONCAT44(local_34 + 1,local_38);
          iVar5 = this->smell_range_;
          iVar4 = local_38;
        } while (iVar3 < iVar5);
      }
      iVar3 = iVar4 + 1;
    } while (iVar4 < iVar5);
  }
  return false;
}

Assistant:

bool Pocman::SmellFood(const PocmanState& pocstate) const {
	Coord smellPos;
	for (smellPos.x = -smell_range_; smellPos.x <= smell_range_; smellPos.x++)
		for (smellPos.y = -smell_range_; smellPos.y <= smell_range_; smellPos.y++)
			if (maze_.Inside(pocstate.pocman_pos + smellPos)
				&& pocstate.food[maze_.Index(pocstate.pocman_pos + smellPos)])
				return true;
	return false;
}